

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tetgen.cxx
# Opt level: O1

void __thiscall tetgenmesh::hilbert_init(tetgenmesh *this,int n)

{
  int iVar1;
  ulong uVar2;
  ulong uVar3;
  uint uVar4;
  uint uVar5;
  int (*paaiVar7) [3] [8];
  ulong uVar8;
  int (*paaiVar9) [3] [8];
  uint auStack_48 [8];
  int gc [8];
  ulong uVar6;
  
  uVar5 = (uint)(n != 2) * 4 + 4;
  uVar6 = (ulong)uVar5;
  uVar2 = 0;
  do {
    auStack_48[uVar2] = (uint)(uVar2 >> 1) & 0x7fffffff ^ (uint)uVar2;
    uVar2 = uVar2 + 1;
  } while (uVar6 != uVar2);
  paaiVar7 = this->transgc;
  uVar2 = 0;
  do {
    if (0 < n) {
      uVar3 = 0;
      paaiVar9 = paaiVar7;
      do {
        uVar8 = 0;
        do {
          uVar4 = auStack_48[uVar8] * (2 << ((byte)uVar3 & 0x1f));
          (*paaiVar9)[0][uVar8] =
               ((int)uVar4 / (int)uVar5 | uVar4) & (uint)(n != 2) * 4 + 3 ^ (uint)uVar2;
          uVar8 = uVar8 + 1;
        } while (uVar6 != uVar8);
        uVar3 = uVar3 + 1;
        paaiVar9 = (int (*) [3] [8])(*paaiVar9 + 1);
      } while (uVar3 != (uint)n);
    }
    uVar2 = uVar2 + 1;
    paaiVar7 = paaiVar7 + 1;
  } while (uVar2 != uVar6);
  this->tsb1mod3[0] = 0;
  uVar2 = 1;
  do {
    uVar3 = uVar2 + 1;
    uVar5 = (uint)uVar3 ^ (uint)uVar2;
    iVar1 = 0;
    if (uVar5 != 1) {
      iVar1 = 0;
      do {
        uVar5 = (int)uVar5 >> 1;
        iVar1 = iVar1 + 1;
      } while (1 < uVar5);
    }
    this->tsb1mod3[uVar2] = iVar1 % n;
    uVar2 = uVar3;
  } while (uVar3 != uVar6);
  return;
}

Assistant:

void tetgenmesh::hilbert_init(int n)
{
  int gc[8], N, mask, travel_bit;
  int e, d, f, k, g;
  int v, c;
  int i;

  N = (n == 2) ? 4 : 8;
  mask = (n == 2) ? 3 : 7;

  // Generate the Gray code sequence.
  for (i = 0; i < N; i++) {
    gc[i] = i ^ (i >> 1);
  }

  for (e = 0; e < N; e++) {
    for (d = 0; d < n; d++) {
      // Calculate the end point (f).
      f = e ^ (1 << d);  // Toggle the d-th bit of 'e'.
      // travel_bit = 2**p, the bit we want to travel. 
      travel_bit = e ^ f;
      for (i = 0; i < N; i++) {
        // // Rotate gc[i] left by (p + 1) % n bits.
        k = gc[i] * (travel_bit * 2);
        g = ((k | (k / N)) & mask);
        // Calculate the permuted Gray code by xor with the start point (e).
        transgc[e][d][i] = (g ^ e);
      }
    } // d
  } // e

  // Count the consecutive '1' bits (trailing) on the right.
  tsb1mod3[0] = 0;
  for (i = 1; i < N; i++) {
    v = ~i; // Count the 0s.
    v = (v ^ (v - 1)) >> 1; // Set v's trailing 0s to 1s and zero rest
    for (c = 0; v; c++) {
      v >>= 1;
    }
    tsb1mod3[i] = c % n;
  }
}